

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jbcoin::STTx::checkSingleSign_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,STTx *this)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  size_t in_R8;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  eVar4;
  bool local_102;
  bool local_101 [9];
  exception *anon_var_0;
  size_t local_f0;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_e8;
  enable_if_t<std::is_same<unsigned_char,_char>::value____std::is_same<unsigned_char,_unsigned_char>::value,_Slice>
  local_d8;
  PublicKey local_c8;
  undefined1 local_98 [8];
  Blob data;
  Blob signature;
  type local_58;
  undefined1 local_50 [8];
  Blob spk;
  byte local_22;
  bool local_21;
  bool fullyCanonical;
  bool validSig;
  STTx *pSStack_20;
  STTx *this_local;
  type *local_10;
  
  pSStack_20 = this;
  this_local = (STTx *)__return_storage_ptr__;
  bVar1 = STObject::isFieldPresent(&this->super_STObject,(SField *)sfSigners);
  if (bVar1) {
    local_21 = false;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_const_char_(&)[36],_true>
              (__return_storage_ptr__,&local_21,(char (*) [36])"Cannot both single- and multi-sign."
              );
  }
  else {
    local_22 = 0;
    uVar2 = STObject::getFlags(&this->super_STObject);
    STObject::getFieldVL((Blob *)local_50,&this->super_STObject,(SField *)sfSigningPubKey);
    eVar4 = makeSlice<unsigned_char,std::allocator<unsigned_char>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = eVar4.data_;
    local_58 = (type)publicKeyType((Slice *)&signature.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_10 = &local_58;
    bVar1 = boost::optional<jbcoin::KeyType>::operator!((optional<jbcoin::KeyType> *)local_10);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      STObject::getFieldVL
                ((Blob *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_STObject,
                 (SField *)sfTxnSignature);
      getSigningData((Blob *)local_98,this);
      local_d8 = makeSlice<unsigned_char,std::allocator<unsigned_char>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      PublicKey::PublicKey(&local_c8,&local_d8);
      local_e8 = makeSlice<unsigned_char,std::allocator<unsigned_char>>
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      eVar4 = makeSlice<unsigned_char,std::allocator<unsigned_char>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_f0 = eVar4.size_;
      anon_var_0 = (exception *)eVar4.data_;
      iVar3 = verify((EVP_PKEY_CTX *)&local_c8,(uchar *)&local_e8,(size_t)&anon_var_0,
                     (uchar *)(ulong)(uVar2 >> 0x1f),in_R8);
      local_22 = (byte)iVar3 & 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    if (local_22 == 0) {
      local_101[0] = false;
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<bool,_const_char_(&)[19],_true>
                (__return_storage_ptr__,local_101,(char (*) [19])"Invalid signature.");
    }
    else {
      local_102 = true;
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<bool,_const_char_(&)[1],_true>(__return_storage_ptr__,&local_102,(char (*) [1])0x46cf7c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> STTx::checkSingleSign () const
{
    // We don't allow both a non-empty sfSigningPubKey and an sfSigners.
    // That would allow the transaction to be signed two ways.  So if both
    // fields are present the signature is invalid.
    if (isFieldPresent (sfSigners))
        return {false, "Cannot both single- and multi-sign."};

    bool validSig = false;
    try
    {
        bool const fullyCanonical = (getFlags() & tfFullyCanonicalSig);
        auto const spk = getFieldVL (sfSigningPubKey);

        if (publicKeyType (makeSlice(spk)))
        {
            Blob const signature = getFieldVL (sfTxnSignature);
            Blob const data = getSigningData (*this);

            validSig = verify (
                PublicKey (makeSlice(spk)),
                makeSlice(data),
                makeSlice(signature),
                fullyCanonical);
        }
    }
    catch (std::exception const&)
    {
        // Assume it was a signature failure.
        validSig = false;
    }
    if (validSig == false)
        return {false, "Invalid signature."};

    return {true, ""};
}